

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O0

QRegion __thiscall QRegion::united(QRegion *this,QRegion *r)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  QRegionPrivate *in_RDX;
  QRegionPrivate *in_RSI;
  QRegionPrivate *in_RDI;
  QRegion *result;
  QRegionPrivate *in_stack_00000050;
  QRegionPrivate *in_stack_00000058;
  QRegionPrivate *this_00;
  undefined5 in_stack_ffffffffffffffe0;
  undefined1 in_stack_ffffffffffffffe5;
  undefined1 uVar4;
  undefined1 in_stack_ffffffffffffffe6;
  undefined1 in_stack_ffffffffffffffe7;
  QRegionPrivate *r2;
  QRegionPrivate *r1;
  
  this_00 = in_RDI;
  r2 = in_RSI;
  r1 = in_RDI;
  bVar3 = isEmptyHelper(*(QRegionPrivate **)(*(long *)in_RSI + 8));
  if (bVar3) {
    QRegion((QRegion *)this_00,(QRegion *)in_RDI);
  }
  else {
    bVar3 = isEmptyHelper(*(QRegionPrivate **)(*(long *)in_RDX + 8));
    if (bVar3) {
      QRegion((QRegion *)this_00,(QRegion *)in_RDI);
    }
    else {
      lVar1._0_4_ = in_RSI->numRects;
      lVar1._4_4_ = in_RSI->innerArea;
      lVar2._0_4_ = in_RDX->numRects;
      lVar2._4_4_ = in_RDX->innerArea;
      if (lVar1 == lVar2) {
        QRegion((QRegion *)this_00,(QRegion *)in_RDI);
      }
      else {
        bVar3 = QRegionPrivate::contains(this_00,in_RDI);
        if (bVar3) {
          QRegion((QRegion *)this_00,(QRegion *)in_RDI);
        }
        else {
          bVar3 = QRegionPrivate::contains(this_00,in_RDI);
          if (bVar3) {
            QRegion((QRegion *)this_00,(QRegion *)in_RDI);
          }
          else {
            bVar3 = QRegionPrivate::canAppend
                              ((QRegionPrivate *)
                               CONCAT17(in_stack_ffffffffffffffe7,
                                        CONCAT16(in_stack_ffffffffffffffe6,
                                                 CONCAT15(in_stack_ffffffffffffffe5,
                                                          in_stack_ffffffffffffffe0))),in_RSI);
            if (bVar3) {
              *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
              QRegion((QRegion *)this_00,(QRegion *)in_RDI);
              detach((QRegion *)this_00);
              QRegionPrivate::append(in_stack_00000058,in_stack_00000050);
            }
            else {
              bVar3 = QRegionPrivate::canPrepend
                                ((QRegionPrivate *)
                                 CONCAT17(in_stack_ffffffffffffffe7,
                                          CONCAT16(in_stack_ffffffffffffffe6,
                                                   CONCAT15(in_stack_ffffffffffffffe5,
                                                            in_stack_ffffffffffffffe0))),in_RSI);
              if (bVar3) {
                *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
                QRegion((QRegion *)this_00,(QRegion *)in_RDI);
                detach((QRegion *)this_00);
                QRegionPrivate::prepend(in_stack_00000058,in_stack_00000050);
              }
              else {
                bVar3 = EqualRegion(r1,r2);
                if (bVar3) {
                  QRegion((QRegion *)this_00,(QRegion *)in_RDI);
                }
                else {
                  uVar4 = 0;
                  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
                  QRegion((QRegion *)in_RDI);
                  detach((QRegion *)this_00);
                  UnionRegion(in_RDX,(QRegionPrivate *)
                                     CONCAT17(in_stack_ffffffffffffffe7,
                                              CONCAT16(in_stack_ffffffffffffffe6,
                                                       CONCAT15(uVar4,in_stack_ffffffffffffffe0))),
                              in_RSI);
                }
              }
            }
          }
        }
      }
    }
  }
  return (QRegion)(QRegionData *)this_00;
}

Assistant:

QRegion QRegion::united(const QRegion &r) const
{
    if (isEmptyHelper(d->qt_rgn))
        return r;
    if (isEmptyHelper(r.d->qt_rgn))
        return *this;
    if (d == r.d)
        return *this;

    if (d->qt_rgn->contains(*r.d->qt_rgn)) {
        return *this;
    } else if (r.d->qt_rgn->contains(*d->qt_rgn)) {
        return r;
    } else if (d->qt_rgn->canAppend(r.d->qt_rgn)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->append(r.d->qt_rgn);
        return result;
    } else if (d->qt_rgn->canPrepend(r.d->qt_rgn)) {
        QRegion result(*this);
        result.detach();
        result.d->qt_rgn->prepend(r.d->qt_rgn);
        return result;
    } else if (EqualRegion(d->qt_rgn, r.d->qt_rgn)) {
        return *this;
    } else {
        QRegion result;
        result.detach();
        UnionRegion(d->qt_rgn, r.d->qt_rgn, *result.d->qt_rgn);
        return result;
    }
}